

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O0

int Map_MatchCompare(Map_Man_t *pMan,Map_Match_t *pM1,Map_Match_t *pM2,int fDoingArea)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int M2act;
  int M1act;
  int M2req;
  int M1req;
  int fDoingArea_local;
  Map_Match_t *pM2_local;
  Map_Match_t *pM1_local;
  Map_Man_t *pMan_local;
  
  if (fDoingArea == 0) {
    if ((pM2->tArrive).Worst - pMan->fEpsilon <= (pM1->tArrive).Worst) {
      if ((pM1->tArrive).Worst <= (pM2->tArrive).Worst + pMan->fEpsilon) {
        if (pM2->AreaFlow - pMan->fEpsilon <= pM1->AreaFlow) {
          if (pM1->AreaFlow <= pM2->AreaFlow + pMan->fEpsilon) {
            if ((*(uint *)&pM2->pSuperBest->field_0x4 >> 8 & 0xf) <
                (*(uint *)&pM1->pSuperBest->field_0x4 >> 8 & 0xf)) {
              pMan_local._4_4_ = 0;
            }
            else if ((*(uint *)&pM1->pSuperBest->field_0x4 >> 8 & 0xf) <
                     (*(uint *)&pM2->pSuperBest->field_0x4 >> 8 & 0xf)) {
              pMan_local._4_4_ = 1;
            }
            else if ((*(uint *)&pM1->pSuperBest->field_0x4 >> 2 & 7) <
                     (*(uint *)&pM2->pSuperBest->field_0x4 >> 2 & 7)) {
              pMan_local._4_4_ = 0;
            }
            else if ((*(uint *)&pM2->pSuperBest->field_0x4 >> 2 & 7) <
                     (*(uint *)&pM1->pSuperBest->field_0x4 >> 2 & 7)) {
              pMan_local._4_4_ = 1;
            }
            else {
              pMan_local._4_4_ = 0;
            }
          }
          else {
            pMan_local._4_4_ = 1;
          }
        }
        else {
          pMan_local._4_4_ = 0;
        }
      }
      else {
        pMan_local._4_4_ = 1;
      }
    }
    else {
      pMan_local._4_4_ = 0;
    }
  }
  else if (pM2->AreaFlow - pMan->fEpsilon <= pM1->AreaFlow) {
    if (pM1->AreaFlow <= pM2->AreaFlow + pMan->fEpsilon) {
      if (((pMan->fUseProfile != 0) && (pM1->pSuperBest != (Map_Super_t *)0x0)) &&
         (pM1->pSuperBest != (Map_Super_t *)0x0)) {
        iVar1 = Mio_GateReadProfile(pM1->pSuperBest->pRoot);
        iVar2 = Mio_GateReadProfile(pM2->pSuperBest->pRoot);
        iVar3 = Mio_GateReadProfile2(pM1->pSuperBest->pRoot);
        iVar4 = Mio_GateReadProfile2(pM2->pSuperBest->pRoot);
        if ((iVar3 < iVar1) && (iVar2 < iVar4)) {
          return 0;
        }
        if ((iVar4 < iVar2) && (iVar1 < iVar3)) {
          return 1;
        }
      }
      if ((pM2->tArrive).Worst - pMan->fEpsilon <= (pM1->tArrive).Worst) {
        if ((pM1->tArrive).Worst <= (pM2->tArrive).Worst + pMan->fEpsilon) {
          if ((*(uint *)&pM2->pSuperBest->field_0x4 >> 8 & 0xf) <
              (*(uint *)&pM1->pSuperBest->field_0x4 >> 8 & 0xf)) {
            pMan_local._4_4_ = 0;
          }
          else if ((*(uint *)&pM1->pSuperBest->field_0x4 >> 8 & 0xf) <
                   (*(uint *)&pM2->pSuperBest->field_0x4 >> 8 & 0xf)) {
            pMan_local._4_4_ = 1;
          }
          else if ((*(uint *)&pM1->pSuperBest->field_0x4 >> 2 & 7) <
                   (*(uint *)&pM2->pSuperBest->field_0x4 >> 2 & 7)) {
            pMan_local._4_4_ = 0;
          }
          else if ((*(uint *)&pM2->pSuperBest->field_0x4 >> 2 & 7) <
                   (*(uint *)&pM1->pSuperBest->field_0x4 >> 2 & 7)) {
            pMan_local._4_4_ = 1;
          }
          else {
            pMan_local._4_4_ = 0;
          }
        }
        else {
          pMan_local._4_4_ = 1;
        }
      }
      else {
        pMan_local._4_4_ = 0;
      }
    }
    else {
      pMan_local._4_4_ = 1;
    }
  }
  else {
    pMan_local._4_4_ = 0;
  }
  return pMan_local._4_4_;
}

Assistant:

int Map_MatchCompare( Map_Man_t * pMan, Map_Match_t * pM1, Map_Match_t * pM2, int fDoingArea )
{
//    if ( pM1->pSuperBest == pM2->pSuperBest )
//        return 0;
    if ( !fDoingArea )
    {
        // compare the arrival times
        if ( pM1->tArrive.Worst < pM2->tArrive.Worst - pMan->fEpsilon )
            return 0;
        if ( pM1->tArrive.Worst > pM2->tArrive.Worst + pMan->fEpsilon )
            return 1;
        // compare the areas or area flows
        if ( pM1->AreaFlow < pM2->AreaFlow - pMan->fEpsilon )
            return 0;
        if ( pM1->AreaFlow > pM2->AreaFlow + pMan->fEpsilon )
            return 1;
        // compare the fanout limits
        if ( pM1->pSuperBest->nFanLimit > pM2->pSuperBest->nFanLimit )
            return 0;
        if ( pM1->pSuperBest->nFanLimit < pM2->pSuperBest->nFanLimit )
            return 1;
        // compare the number of leaves
        if ( pM1->pSuperBest->nFanins < pM2->pSuperBest->nFanins )
            return 0;
        if ( pM1->pSuperBest->nFanins > pM2->pSuperBest->nFanins )
            return 1;
        // otherwise prefer the old cut
        return 0;
    }
    else
    {
        // compare the areas or area flows
        if ( pM1->AreaFlow < pM2->AreaFlow - pMan->fEpsilon )
            return 0;
        if ( pM1->AreaFlow > pM2->AreaFlow + pMan->fEpsilon )
            return 1;

        // make decision based on cell profile
        if ( pMan->fUseProfile && pM1->pSuperBest && pM1->pSuperBest )
        {
            int M1req = Mio_GateReadProfile(pM1->pSuperBest->pRoot);
            int M2req = Mio_GateReadProfile(pM2->pSuperBest->pRoot);
            int M1act = Mio_GateReadProfile2(pM1->pSuperBest->pRoot);
            int M2act = Mio_GateReadProfile2(pM2->pSuperBest->pRoot);
            //printf( "%d %d  ", M1req, M2req );
            if ( M1act < M1req && M2act > M2req )
                return 0;
            if ( M2act < M2req && M1act > M1req )
                return 1;
        }

        // compare the arrival times
        if ( pM1->tArrive.Worst < pM2->tArrive.Worst - pMan->fEpsilon )
            return 0;
        if ( pM1->tArrive.Worst > pM2->tArrive.Worst + pMan->fEpsilon )
            return 1;
        // compare the fanout limits
        if ( pM1->pSuperBest->nFanLimit > pM2->pSuperBest->nFanLimit )
            return 0;
        if ( pM1->pSuperBest->nFanLimit < pM2->pSuperBest->nFanLimit )
            return 1;
        // compare the number of leaves
        if ( pM1->pSuperBest->nFanins < pM2->pSuperBest->nFanins )
            return 0;
        if ( pM1->pSuperBest->nFanins > pM2->pSuperBest->nFanins )
            return 1;
        // otherwise prefer the old cut
        return 0;
    }
}